

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_dr_flac__decode_flac_frame(ma_dr_flac *pFlac)

{
  byte bVar1;
  ma_uint8 mVar2;
  ma_int32 *pmVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  ma_dr_flac *pmVar6;
  byte bVar7;
  ma_bool32 mVar8;
  uint uVar9;
  ushort uVar10;
  ma_uint32 lpcOrder;
  ushort uVar11;
  ulong uVar12;
  ma_dr_flac_subframe *pSubframe;
  ulong uVar13;
  ma_uint16 *pmVar14;
  uint uVar15;
  ma_int32 *pDecodedSamples;
  uint uVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  int iVar21;
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int iVar26;
  ma_uint8 local_f9;
  ma_dr_flac_bs *local_f8;
  ulong local_f0;
  long local_e8;
  ma_int32 *local_e0;
  uint local_d4;
  ulong local_d0;
  ma_dr_flac *local_c8;
  ma_dr_flac_subframe *local_c0;
  ma_uint16 desiredCRC16;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  long lVar23;
  
  (pFlac->currentFLACFrame).subframes[7].subframeType = '\0';
  (pFlac->currentFLACFrame).subframes[7].wastedBitsPerSample = '\0';
  (pFlac->currentFLACFrame).subframes[7].lpcOrder = '\0';
  *(undefined5 *)&(pFlac->currentFLACFrame).subframes[7].field_0x3 = 0;
  (pFlac->currentFLACFrame).subframes[7].pSamplesS32 = (ma_int32 *)0x0;
  (pFlac->currentFLACFrame).subframes[6].subframeType = '\0';
  (pFlac->currentFLACFrame).subframes[6].wastedBitsPerSample = '\0';
  (pFlac->currentFLACFrame).subframes[6].lpcOrder = '\0';
  *(undefined5 *)&(pFlac->currentFLACFrame).subframes[6].field_0x3 = 0;
  (pFlac->currentFLACFrame).subframes[6].pSamplesS32 = (ma_int32 *)0x0;
  (pFlac->currentFLACFrame).subframes[5].subframeType = '\0';
  (pFlac->currentFLACFrame).subframes[5].wastedBitsPerSample = '\0';
  (pFlac->currentFLACFrame).subframes[5].lpcOrder = '\0';
  *(undefined5 *)&(pFlac->currentFLACFrame).subframes[5].field_0x3 = 0;
  (pFlac->currentFLACFrame).subframes[5].pSamplesS32 = (ma_int32 *)0x0;
  (pFlac->currentFLACFrame).subframes[4].subframeType = '\0';
  (pFlac->currentFLACFrame).subframes[4].wastedBitsPerSample = '\0';
  (pFlac->currentFLACFrame).subframes[4].lpcOrder = '\0';
  *(undefined5 *)&(pFlac->currentFLACFrame).subframes[4].field_0x3 = 0;
  (pFlac->currentFLACFrame).subframes[4].pSamplesS32 = (ma_int32 *)0x0;
  (pFlac->currentFLACFrame).subframes[3].subframeType = '\0';
  (pFlac->currentFLACFrame).subframes[3].wastedBitsPerSample = '\0';
  (pFlac->currentFLACFrame).subframes[3].lpcOrder = '\0';
  *(undefined5 *)&(pFlac->currentFLACFrame).subframes[3].field_0x3 = 0;
  (pFlac->currentFLACFrame).subframes[3].pSamplesS32 = (ma_int32 *)0x0;
  (pFlac->currentFLACFrame).subframes[2].subframeType = '\0';
  (pFlac->currentFLACFrame).subframes[2].wastedBitsPerSample = '\0';
  (pFlac->currentFLACFrame).subframes[2].lpcOrder = '\0';
  *(undefined5 *)&(pFlac->currentFLACFrame).subframes[2].field_0x3 = 0;
  (pFlac->currentFLACFrame).subframes[2].pSamplesS32 = (ma_int32 *)0x0;
  (pFlac->currentFLACFrame).subframes[1].subframeType = '\0';
  (pFlac->currentFLACFrame).subframes[1].wastedBitsPerSample = '\0';
  (pFlac->currentFLACFrame).subframes[1].lpcOrder = '\0';
  *(undefined5 *)&(pFlac->currentFLACFrame).subframes[1].field_0x3 = 0;
  (pFlac->currentFLACFrame).subframes[1].pSamplesS32 = (ma_int32 *)0x0;
  (pFlac->currentFLACFrame).subframes[0].subframeType = '\0';
  (pFlac->currentFLACFrame).subframes[0].wastedBitsPerSample = '\0';
  (pFlac->currentFLACFrame).subframes[0].lpcOrder = '\0';
  *(undefined5 *)&(pFlac->currentFLACFrame).subframes[0].field_0x3 = 0;
  (pFlac->currentFLACFrame).subframes[0].pSamplesS32 = (ma_int32 *)0x0;
  if (pFlac->maxBlockSizeInPCMFrames < (pFlac->currentFLACFrame).header.blockSizeInPCMFrames) {
    return MA_ERROR;
  }
  bVar1 = (&DAT_0017c9f0)[(char)(pFlac->currentFLACFrame).header.channelAssignment];
  if (bVar1 != pFlac->channels) {
    return MA_ERROR;
  }
  local_c0 = (pFlac->currentFLACFrame).subframes;
  local_f8 = &pFlac->bs;
  bVar7 = 1;
  if (1 < bVar1) {
    bVar7 = bVar1;
  }
  local_d0 = (ulong)bVar7;
  local_e8 = 0;
  uVar12 = 0;
  local_c8 = pFlac;
  do {
    pmVar6 = local_c8;
    pmVar3 = local_c8->pDecodedSamples;
    uVar19 = (ulong)(local_c8->currentFLACFrame).header.blockSizeInPCMFrames;
    pSubframe = local_c0 + uVar12;
    mVar8 = ma_dr_flac__read_subframe_header(local_f8,pSubframe);
    if (mVar8 == 0) {
      return MA_ERROR;
    }
    mVar2 = (pmVar6->currentFLACFrame).header.channelAssignment;
    uVar16 = (uint)(pmVar6->currentFLACFrame).header.bitsPerSample;
    if (mVar2 == '\b') {
      if (uVar12 != 1) goto LAB_00165e21;
LAB_00165e46:
      uVar16 = uVar16 + 1;
    }
    else {
      if (uVar12 == 1 && mVar2 == '\n') goto LAB_00165e46;
LAB_00165e21:
      uVar16 = uVar16 + (uVar12 == 0 && mVar2 == '\t');
    }
    if ((0x20 < uVar16) ||
       (uVar17 = uVar16 - pSubframe->wastedBitsPerSample,
       uVar16 < pSubframe->wastedBitsPerSample || uVar17 == 0)) {
      return MA_ERROR;
    }
    pDecodedSamples = pmVar3 + uVar12 * uVar19;
    pSubframe->pSamplesS32 = pDecodedSamples;
    uVar11 = (pmVar6->currentFLACFrame).header.blockSizeInPCMFrames;
    uVar13 = (ulong)uVar11;
    uVar10 = (ushort)pSubframe->lpcOrder;
    if (uVar11 < uVar10) {
      return MA_ERROR;
    }
    bVar1 = pSubframe->subframeType;
    if (bVar1 < 8) {
      if (bVar1 == 0) {
        mVar8 = ma_dr_flac__read_int32(local_f8,uVar17,(ma_int32 *)&desiredCRC16);
        auVar5 = _DAT_00178d70;
        if ((uVar13 != 0) && (mVar8 != 0)) {
          lVar18 = uVar13 - 1;
          auVar20._8_4_ = (int)lVar18;
          auVar20._0_8_ = lVar18;
          auVar20._12_4_ = (int)((ulong)lVar18 >> 0x20);
          lVar18 = uVar19 * local_e8;
          auVar20 = auVar20 ^ _DAT_00178d70;
          uVar19 = 0;
          auVar22 = _DAT_00178d60;
          auVar24 = _DAT_00178d90;
          do {
            auVar25 = auVar22 ^ auVar5;
            iVar21 = auVar20._4_4_;
            if ((bool)(~(auVar25._4_4_ == iVar21 && auVar20._0_4_ < auVar25._0_4_ ||
                        iVar21 < auVar25._4_4_) & 1)) {
              *(uint *)((long)pmVar3 + uVar19 + lVar18) = _desiredCRC16;
            }
            if ((auVar25._12_4_ != auVar20._12_4_ || auVar25._8_4_ <= auVar20._8_4_) &&
                auVar25._12_4_ <= auVar20._12_4_) {
              *(uint *)((long)pmVar3 + uVar19 + lVar18 + 4) = _desiredCRC16;
            }
            auVar25 = auVar24 ^ auVar5;
            iVar26 = auVar25._4_4_;
            if (iVar26 <= iVar21 && (iVar26 != iVar21 || auVar25._0_4_ <= auVar20._0_4_)) {
              *(uint *)((long)pmVar3 + uVar19 + lVar18 + 8) = _desiredCRC16;
              *(uint *)((long)pmVar3 + uVar19 + lVar18 + 0xc) = _desiredCRC16;
            }
            lVar23 = auVar22._8_8_;
            auVar22._0_8_ = auVar22._0_8_ + 4;
            auVar22._8_8_ = lVar23 + 4;
            lVar23 = auVar24._8_8_;
            auVar24._0_8_ = auVar24._0_8_ + 4;
            auVar24._8_8_ = lVar23 + 4;
            uVar19 = uVar19 + 0x10;
          } while (((uint)uVar11 * 4 + 0xc & 0xfffffff0) != uVar19);
        }
      }
      else {
        if (bVar1 != 1) {
          return MA_ERROR;
        }
        if (uVar13 != 0) {
          lVar18 = uVar19 * local_e8;
          uVar19 = 0;
          do {
            mVar8 = ma_dr_flac__read_int32(local_f8,uVar17,(ma_int32 *)&desiredCRC16);
            if (mVar8 == 0) break;
            *(uint *)((long)pmVar3 + uVar19 * 4 + lVar18) = _desiredCRC16;
            uVar19 = uVar19 + 1;
          } while (uVar13 != uVar19);
        }
      }
    }
    else {
      uVar13 = (ulong)uVar10;
      if (bVar1 == 8) {
        if (uVar10 == 0) {
          uVar16 = 0;
          local_f0 = uVar13;
        }
        else {
          uVar16 = (uint)uVar10;
          lVar18 = uVar19 * local_e8;
          uVar19 = 0;
          local_f0 = uVar13;
          local_e0 = pDecodedSamples;
          do {
            mVar8 = ma_dr_flac__read_int32(local_f8,uVar17,(ma_int32 *)&desiredCRC16);
            if (mVar8 == 0) goto LAB_001661da;
            *(uint *)((long)pmVar3 + uVar19 * 4 + lVar18) = _desiredCRC16;
            uVar19 = uVar19 + 1;
            pDecodedSamples = local_e0;
          } while (uVar13 != uVar19);
        }
        pmVar14 = (ma_uint16 *)
                  (ma_dr_flac__decode_samples__fixed(ma_dr_flac_bs*,unsigned_int,unsigned_int,unsigned_char,int*)
                   ::lpcCoefficientsTable + (uVar16 << 4));
        lpcOrder = (ma_uint32)local_f0;
        uVar15 = 0;
        uVar16 = 4;
LAB_001661d1:
        ma_dr_flac__decode_samples_with_residual
                  (local_f8,uVar17,(uint)uVar11,lpcOrder,uVar15,uVar16,(ma_int32 *)pmVar14,
                   pDecodedSamples);
      }
      else {
        if (bVar1 != 0x20) {
          return MA_ERROR;
        }
        local_e0 = pDecodedSamples;
        if (uVar13 != 0) {
          lVar18 = uVar19 * local_e8;
          uVar19 = 0;
          do {
            mVar8 = ma_dr_flac__read_int32(local_f8,uVar17,(ma_int32 *)&desiredCRC16);
            if (mVar8 == 0) goto LAB_001661da;
            *(uint *)((long)pmVar3 + uVar19 * 4 + lVar18) = _desiredCRC16;
            uVar19 = uVar19 + 1;
          } while (uVar13 != uVar19);
        }
        local_f0 = uVar13;
        mVar8 = ma_dr_flac__read_uint8(local_f8,4,&local_f9);
        mVar2 = local_f9;
        if (((mVar8 != 0) && (local_f9 != '\x0f')) &&
           (mVar8 = ma_dr_flac__read_int32(local_f8,5,(ma_int32 *)&desiredCRC16), mVar8 != 0)) {
          local_d4 = _desiredCRC16;
          if (-1 < (char)desiredCRC16) {
            local_48 = (undefined1  [16])0x0;
            local_58 = (undefined1  [16])0x0;
            local_68 = (undefined1  [16])0x0;
            local_78 = (undefined1  [16])0x0;
            local_88 = (undefined1  [16])0x0;
            local_98 = (undefined1  [16])0x0;
            local_a8 = (undefined1  [16])0x0;
            _desiredCRC16 = (undefined1  [16])0x0;
            uVar16 = (uint)(byte)(mVar2 + 1);
            if (local_f0 != 0) {
              pmVar14 = &desiredCRC16;
              uVar19 = local_f0;
              do {
                mVar8 = ma_dr_flac__read_int32(local_f8,uVar16,(ma_int32 *)pmVar14);
                if (mVar8 == 0) goto LAB_001661da;
                pmVar14 = pmVar14 + 2;
                uVar19 = uVar19 - 1;
              } while (uVar19 != 0);
            }
            uVar15 = local_d4 & 0x7f;
            lpcOrder = (ma_uint32)local_f0;
            pmVar14 = &desiredCRC16;
            pDecodedSamples = local_e0;
            goto LAB_001661d1;
          }
        }
      }
    }
LAB_001661da:
    pmVar6 = local_c8;
    uVar12 = uVar12 + 1;
    local_e8 = local_e8 + 4;
    if (uVar12 == local_d0) {
      uVar16 = (local_c8->bs).consumedBits;
      if ((-uVar16 & 7) != 0) {
        mVar8 = ma_dr_flac__read_uint8(local_f8,-uVar16 & 7,(ma_uint8 *)&desiredCRC16);
        if (mVar8 == 0) {
          return MA_AT_END;
        }
        uVar16 = (pmVar6->bs).consumedBits;
      }
      uVar11 = (pmVar6->bs).crc16;
      uVar19 = (ulong)uVar11;
      uVar17 = (uint)uVar11;
      uVar12 = (pmVar6->bs).crc16Cache;
      if (uVar16 == 0x40) {
        uVar9 = (uint)uVar12;
        uVar10 = (ushort)(uVar12 >> 0x30);
        uVar15 = (uint)(uVar12 >> 0x10);
        uVar16 = (uint)(uVar12 >> 0x18);
        uVar4 = (uint)(uVar12 >> 0x20);
        switch((pmVar6->bs).crc16CacheIgnoredBytes) {
        case 0:
          uVar11 = ma_dr_flac__crc16_table
                   [((uint)ma_dr_flac__crc16_table
                           [((uint)ma_dr_flac__crc16_table
                                   [(uVar4 >> 8 ^
                                    ((uint)ma_dr_flac__crc16_table
                                           [(uint)(uVar11 >> 8) ^ (uint)(byte)(uVar12 >> 0x38)] << 8
                                    ^ (uint)ma_dr_flac__crc16_table
                                            [((uint)uVar10 ^
                                             ((uint)uVar11 << 8 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [(uint)(uVar11 >> 8) ^
                                                    (uint)(byte)(uVar12 >> 0x38)]) >> 8 & 0xff) &
                                             0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                            (uint)ma_dr_flac__crc16_table
                                  [(uVar4 ^ ((uint)ma_dr_flac__crc16_table
                                                   [((uint)uVar10 ^
                                                    ((uint)uVar11 << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [(uint)(uVar11 >> 8) ^
                                                           (uint)(byte)(uVar12 >> 0x38)]) >> 8 &
                                                    0xff) & 0xff] << 8 ^
                                            (uint)ma_dr_flac__crc16_table
                                                  [(uVar4 >> 8 ^
                                                   ((uint)ma_dr_flac__crc16_table
                                                          [(uint)(uVar11 >> 8) ^
                                                           (uint)(byte)(uVar12 >> 0x38)] << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [((uint)uVar10 ^
                                                          ((uint)uVar11 << 8 ^
                                                          (uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar11 >> 8) ^
                                                                 (uint)(byte)(uVar12 >> 0x38)]) >> 8
                                                          & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                            8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar16 & 0xff] << 8 ^
                     uVar9 ^ (uint)ma_dr_flac__crc16_table
                                   [(((uint)ma_dr_flac__crc16_table
                                            [(uVar4 ^ ((uint)ma_dr_flac__crc16_table
                                                             [((uint)uVar10 ^
                                                              ((uint)uVar11 << 8 ^
                                                              (uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar11 >> 8) ^
                                                                     (uint)(byte)(uVar12 >> 0x38)])
                                                              >> 8 & 0xff) & 0xff] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uVar4 >> 8 ^
                                                             ((uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar11 >> 8) ^
                                                                     (uint)(byte)(uVar12 >> 0x38)]
                                                              << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                           [((uint)uVar10 ^
                                                                            ((uint)uVar11 << 8 ^
                                                                            (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar11 >> 8) ^
                                                   (uint)(byte)(uVar12 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                      << 8 ^ (uint)ma_dr_flac__crc16_table
                                                   [((uint)ma_dr_flac__crc16_table
                                                           [(uVar4 >> 8 ^
                                                            ((uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar11 >> 8) ^
                                                                    (uint)(byte)(uVar12 >> 0x38)] <<
                                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar10 ^
                                                                        ((uint)uVar11 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar11 >> 8) ^
                                                   (uint)(byte)(uVar12 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar4 ^ ((uint)ma_dr_flac__crc16_table
                                                                         [((uint)uVar10 ^
                                                                          ((uint)uVar11 << 8 ^
                                                                          (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar11 >> 8) ^
                                                   (uint)(byte)(uVar12 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar4 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar11 >> 8) ^
                                                                 (uint)(byte)(uVar12 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)uVar10 ^
                                                                  ((uint)uVar11 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar11 >> 8) ^
                                                                         (uint)(byte)(uVar12 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar16 & 0xff]
                                     ) >> 8 & 0xff ^ uVar15 & 0xffff) & 0xff]) >> 8 & 0xff] << 8 ^
                   ma_dr_flac__crc16_table
                   [(((uint)ma_dr_flac__crc16_table
                            [(((uint)ma_dr_flac__crc16_table
                                     [(uVar4 ^ ((uint)ma_dr_flac__crc16_table
                                                      [((uint)uVar10 ^
                                                       ((uint)uVar11 << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [(uint)(uVar11 >> 8) ^
                                                              (uint)(byte)(uVar12 >> 0x38)]) >> 8 &
                                                       0xff) & 0xff] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [(uVar4 >> 8 ^
                                                      ((uint)ma_dr_flac__crc16_table
                                                             [(uint)(uVar11 >> 8) ^
                                                              (uint)(byte)(uVar12 >> 0x38)] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [((uint)uVar10 ^
                                                             ((uint)uVar11 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar11 >> 8) ^
                                                                    (uint)(byte)(uVar12 >> 0x38)])
                                                             >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                      0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                              (uint)ma_dr_flac__crc16_table
                                    [((uint)ma_dr_flac__crc16_table
                                            [(uVar4 >> 8 ^
                                             ((uint)ma_dr_flac__crc16_table
                                                    [(uint)(uVar11 >> 8) ^
                                                     (uint)(byte)(uVar12 >> 0x38)] << 8 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [((uint)uVar10 ^
                                                    ((uint)uVar11 << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [(uint)(uVar11 >> 8) ^
                                                           (uint)(byte)(uVar12 >> 0x38)]) >> 8 &
                                                    0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [(uVar4 ^ ((uint)ma_dr_flac__crc16_table
                                                            [((uint)uVar10 ^
                                                             ((uint)uVar11 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar11 >> 8) ^
                                                                    (uint)(byte)(uVar12 >> 0x38)])
                                                             >> 8 & 0xff) & 0xff] << 8 ^
                                                     (uint)ma_dr_flac__crc16_table
                                                           [(uVar4 >> 8 ^
                                                            ((uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar11 >> 8) ^
                                                                    (uint)(byte)(uVar12 >> 0x38)] <<
                                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar10 ^
                                                                        ((uint)uVar11 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar11 >> 8) ^
                                                   (uint)(byte)(uVar12 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff])
                                     >> 8 & 0xff ^ uVar16 & 0xff]) >> 8 & 0xff ^ uVar15 & 0xffff) &
                             0xff] << 8 ^
                     (uint)ma_dr_flac__crc16_table
                           [((uint)ma_dr_flac__crc16_table
                                   [((uint)ma_dr_flac__crc16_table
                                           [(uVar4 >> 8 ^
                                            ((uint)ma_dr_flac__crc16_table
                                                   [(uint)(uVar11 >> 8) ^
                                                    (uint)(byte)(uVar12 >> 0x38)] << 8 ^
                                            (uint)ma_dr_flac__crc16_table
                                                  [((uint)uVar10 ^
                                                   ((uint)uVar11 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar11 >> 8) ^
                                                          (uint)(byte)(uVar12 >> 0x38)]) >> 8 & 0xff
                                                   ) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                    (uint)ma_dr_flac__crc16_table
                                          [(uVar4 ^ ((uint)ma_dr_flac__crc16_table
                                                           [((uint)uVar10 ^
                                                            ((uint)uVar11 << 8 ^
                                                            (uint)ma_dr_flac__crc16_table
                                                                  [(uint)(uVar11 >> 8) ^
                                                                   (uint)(byte)(uVar12 >> 0x38)]) >>
                                                            8 & 0xff) & 0xff] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [(uVar4 >> 8 ^
                                                           ((uint)ma_dr_flac__crc16_table
                                                                  [(uint)(uVar11 >> 8) ^
                                                                   (uint)(byte)(uVar12 >> 0x38)] <<
                                                            8 ^ (uint)ma_dr_flac__crc16_table
                                                                      [((uint)uVar10 ^
                                                                       ((uint)uVar11 << 8 ^
                                                                       (uint)ma_dr_flac__crc16_table
                                                                             [(uint)(uVar11 >> 8) ^
                                                                              (uint)(byte)(uVar12 >>
                                                                                          0x38)]) >>
                                                                       8 & 0xff) & 0xff]) >> 8 &
                                                           0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >> 8
                                    & 0xff ^ uVar16 & 0xff] << 8 ^ uVar9 ^
                            (uint)ma_dr_flac__crc16_table
                                  [(((uint)ma_dr_flac__crc16_table
                                           [(uVar4 ^ ((uint)ma_dr_flac__crc16_table
                                                            [((uint)uVar10 ^
                                                             ((uint)uVar11 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar11 >> 8) ^
                                                                    (uint)(byte)(uVar12 >> 0x38)])
                                                             >> 8 & 0xff) & 0xff] << 8 ^
                                                     (uint)ma_dr_flac__crc16_table
                                                           [(uVar4 >> 8 ^
                                                            ((uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar11 >> 8) ^
                                                                    (uint)(byte)(uVar12 >> 0x38)] <<
                                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar10 ^
                                                                        ((uint)uVar11 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar11 >> 8) ^
                                                   (uint)(byte)(uVar12 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                     << 8 ^ (uint)ma_dr_flac__crc16_table
                                                  [((uint)ma_dr_flac__crc16_table
                                                          [(uVar4 >> 8 ^
                                                           ((uint)ma_dr_flac__crc16_table
                                                                  [(uint)(uVar11 >> 8) ^
                                                                   (uint)(byte)(uVar12 >> 0x38)] <<
                                                            8 ^ (uint)ma_dr_flac__crc16_table
                                                                      [((uint)uVar10 ^
                                                                       ((uint)uVar11 << 8 ^
                                                                       (uint)ma_dr_flac__crc16_table
                                                                             [(uint)(uVar11 >> 8) ^
                                                                              (uint)(byte)(uVar12 >>
                                                                                          0x38)]) >>
                                                                       8 & 0xff) & 0xff]) >> 8 &
                                                           0xff) & 0xff] << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uVar4 ^ ((uint)ma_dr_flac__crc16_table
                                                                          [((uint)uVar10 ^
                                                                           ((uint)uVar11 << 8 ^
                                                                           (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar11 >> 8) ^
                                                   (uint)(byte)(uVar12 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar4 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar11 >> 8) ^
                                                                 (uint)(byte)(uVar12 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)uVar10 ^
                                                                  ((uint)uVar11 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar11 >> 8) ^
                                                                         (uint)(byte)(uVar12 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar16 & 0xff]
                                    ) >> 8 & 0xff ^ uVar15 & 0xffff) & 0xff]) >> 8 & 0xff]) >> 8 &
                     0xff ^ uVar9) & 0xff];
          (pmVar6->bs).crc16 = uVar11;
          break;
        case 1:
          uVar19 = (ulong)(ushort)(uVar11 << 8 ^
                                  ma_dr_flac__crc16_table[(ushort)(uVar10 ^ uVar11 >> 8) & 0xff]);
        case 2:
          uVar19 = (ulong)(ushort)((ushort)((int)uVar19 << 8) ^
                                  ma_dr_flac__crc16_table[(uVar4 >> 8 ^ (uint)(uVar19 >> 8)) & 0xff]
                                  );
        case 3:
          uVar19 = (ulong)(ushort)((ushort)((int)uVar19 << 8) ^
                                  ma_dr_flac__crc16_table[(uVar4 ^ (uint)(uVar19 >> 8)) & 0xff]);
        case 4:
          uVar19 = (ulong)(ushort)((ushort)((int)uVar19 << 8) ^
                                  ma_dr_flac__crc16_table[(uint)(uVar19 >> 8) ^ uVar16 & 0xff]);
        case 5:
          uVar17 = (uint)(ushort)((ushort)((int)uVar19 << 8) ^
                                 ma_dr_flac__crc16_table
                                 [((uint)(uVar19 >> 8) ^ uVar15 & 0xffff) & 0xff]);
        case 6:
          uVar19 = (ulong)(ushort)((ushort)(uVar17 << 8) ^
                                  ma_dr_flac__crc16_table[(uVar9 ^ uVar17) >> 8 & 0xff]);
        case 7:
          uVar11 = (ushort)((int)uVar19 << 8) ^
                   ma_dr_flac__crc16_table[(uVar9 ^ (uint)(uVar19 >> 8)) & 0xff];
        default:
          (pmVar6->bs).crc16 = uVar11;
          (pmVar6->bs).crc16CacheIgnoredBytes = 0;
        }
      }
      else {
        uVar12 = uVar12 >> (-(char)uVar16 & 0x3fU);
        uVar15 = (uint)(uVar12 >> 0x20);
        switch(~(pmVar6->bs).crc16CacheIgnoredBytes + (uVar16 >> 3)) {
        case 7:
          uVar17 = (uint)(ushort)(uVar11 << 8 ^
                                 ma_dr_flac__crc16_table
                                 [(uint)(uVar11 >> 8) ^ (uint)(byte)(uVar12 >> 0x38)]);
        case 6:
          uVar17 = (uint)(ushort)((ushort)(uVar17 << 8) ^
                                 ma_dr_flac__crc16_table
                                 [((uint)(ushort)(uVar12 >> 0x30) ^ uVar17 >> 8) & 0xff]);
        case 5:
          uVar17 = (uint)(ushort)((ushort)(uVar17 << 8) ^
                                 ma_dr_flac__crc16_table[(uVar15 ^ uVar17) >> 8 & 0xff]);
        case 4:
          uVar17 = (uint)(ushort)((ushort)(uVar17 << 8) ^
                                 ma_dr_flac__crc16_table[(uVar15 ^ uVar17 >> 8) & 0xff]);
        case 3:
          uVar17 = (uint)(ushort)((ushort)(uVar17 << 8) ^
                                 ma_dr_flac__crc16_table
                                 [uVar17 >> 8 ^ (uint)(uVar12 >> 0x18) & 0xff]);
        case 2:
          uVar17 = (uint)(ushort)((ushort)(uVar17 << 8) ^
                                 ma_dr_flac__crc16_table
                                 [(uVar17 >> 8 ^ (uint)(uVar12 >> 0x10) & 0xffff) & 0xff]);
        case 1:
          uVar19 = (ulong)(ushort)((ushort)(uVar17 << 8) ^
                                  ma_dr_flac__crc16_table[((uint)uVar12 ^ uVar17) >> 8 & 0xff]);
        case 0:
          uVar11 = (ushort)((int)uVar19 << 8) ^
                   ma_dr_flac__crc16_table[((uint)uVar12 ^ (uint)(uVar19 >> 8)) & 0xff];
        default:
          (pmVar6->bs).crc16 = uVar11;
          (pmVar6->bs).crc16CacheIgnoredBytes = uVar16 >> 3;
        }
      }
      mVar8 = ma_dr_flac__read_uint16(local_f8,0x10,&desiredCRC16);
      if (mVar8 == 0) {
        return MA_AT_END;
      }
      if (uVar11 == desiredCRC16) {
        (pmVar6->currentFLACFrame).pcmFramesRemaining =
             (uint)(pmVar6->currentFLACFrame).header.blockSizeInPCMFrames;
        return MA_SUCCESS;
      }
      return MA_CRC_MISMATCH;
    }
  } while( true );
}

Assistant:

static ma_result ma_dr_flac__decode_flac_frame(ma_dr_flac* pFlac)
{
    int channelCount;
    int i;
    ma_uint8 paddingSizeInBits;
    ma_uint16 desiredCRC16;
#ifndef MA_DR_FLAC_NO_CRC
    ma_uint16 actualCRC16;
#endif
    MA_DR_FLAC_ZERO_MEMORY(pFlac->currentFLACFrame.subframes, sizeof(pFlac->currentFLACFrame.subframes));
    if (pFlac->currentFLACFrame.header.blockSizeInPCMFrames > pFlac->maxBlockSizeInPCMFrames) {
        return MA_ERROR;
    }
    channelCount = ma_dr_flac__get_channel_count_from_channel_assignment(pFlac->currentFLACFrame.header.channelAssignment);
    if (channelCount != (int)pFlac->channels) {
        return MA_ERROR;
    }
    for (i = 0; i < channelCount; ++i) {
        if (!ma_dr_flac__decode_subframe(&pFlac->bs, &pFlac->currentFLACFrame, i, pFlac->pDecodedSamples + (pFlac->currentFLACFrame.header.blockSizeInPCMFrames * i))) {
            return MA_ERROR;
        }
    }
    paddingSizeInBits = (ma_uint8)(MA_DR_FLAC_CACHE_L1_BITS_REMAINING(&pFlac->bs) & 7);
    if (paddingSizeInBits > 0) {
        ma_uint8 padding = 0;
        if (!ma_dr_flac__read_uint8(&pFlac->bs, paddingSizeInBits, &padding)) {
            return MA_AT_END;
        }
    }
#ifndef MA_DR_FLAC_NO_CRC
    actualCRC16 = ma_dr_flac__flush_crc16(&pFlac->bs);
#endif
    if (!ma_dr_flac__read_uint16(&pFlac->bs, 16, &desiredCRC16)) {
        return MA_AT_END;
    }
#ifndef MA_DR_FLAC_NO_CRC
    if (actualCRC16 != desiredCRC16) {
        return MA_CRC_MISMATCH;
    }
#endif
    pFlac->currentFLACFrame.pcmFramesRemaining = pFlac->currentFLACFrame.header.blockSizeInPCMFrames;
    return MA_SUCCESS;
}